

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

void mk_sched_worker_cb_free(mk_server *server)

{
  mk_list *__mptr;
  mk_sched_worker_cb *wcb;
  mk_list *head;
  mk_list *tmp;
  mk_server *server_local;
  
  wcb = (mk_sched_worker_cb *)(server->sched_worker_callbacks).next;
  head = (mk_list *)wcb->data;
  while (wcb != (mk_sched_worker_cb *)&server->sched_worker_callbacks) {
    mk_list_del((mk_list *)wcb);
    mk_mem_free(&wcb[-1]._head);
    wcb = (mk_sched_worker_cb *)head;
    head = head->next;
  }
  return;
}

Assistant:

void mk_sched_worker_cb_free(struct mk_server *server)
{
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_sched_worker_cb *wcb;

    mk_list_foreach_safe(head, tmp, &server->sched_worker_callbacks) {
        wcb = mk_list_entry(head, struct mk_sched_worker_cb, _head);
        mk_list_del(&wcb->_head);
        mk_mem_free(wcb);
    }
}